

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void body(LexState *ls,expdesc *e,int needself,int line)

{
  Token *pTVar1;
  Token *pTVar2;
  FuncState *pFVar3;
  Proto *pPVar4;
  global_State *g;
  SemInfo SVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  TString *pTVar9;
  Proto **ppPVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  FuncState new_fs;
  FuncState local_288;
  
  open_func(ls,&local_288);
  (local_288.f)->linedefined = line;
  checknext(ls,0x28);
  if (needself != 0) {
    pTVar9 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar9,0);
    pFVar3 = ls->fs;
    bVar11 = pFVar3->nactvar + 1;
    pFVar3->nactvar = bVar11;
    pFVar3->f->locvars[*(ushort *)&pFVar3->upvalues[(ulong)bVar11 + 0x3b].info].startpc = pFVar3->pc
    ;
  }
  pFVar3 = ls->fs;
  pPVar4 = pFVar3->f;
  pPVar4->is_vararg = '\0';
  iVar8 = 0;
  if ((ls->t).token != 0x29) {
    pTVar1 = &ls->t;
    pTVar2 = &ls->lookahead;
    iVar8 = 0;
    do {
      iVar7 = pTVar1->token;
      if (iVar7 == 0x117) {
        iVar7 = (ls->lookahead).token;
        ls->lastline = ls->linenumber;
        if (iVar7 == 0x11f) {
          iVar7 = llex(ls,&(ls->t).seminfo);
          (ls->t).token = iVar7;
        }
        else {
          uVar6 = *(undefined4 *)&pTVar2->field_0x4;
          SVar5 = (ls->lookahead).seminfo;
          pTVar1->token = pTVar2->token;
          *(undefined4 *)&pTVar1->field_0x4 = uVar6;
          (ls->t).seminfo = SVar5;
          pTVar2->token = 0x11f;
        }
        pPVar4->is_vararg = pPVar4->is_vararg | 2;
      }
      else {
        if (iVar7 != 0x11d) {
          luaX_lexerror(ls,"<name> or \'...\' expected",iVar7);
        }
        pTVar9 = str_checkname(ls);
        new_localvar(ls,pTVar9,iVar8);
        iVar8 = iVar8 + 1;
      }
      if (pPVar4->is_vararg != '\0') break;
      iVar7 = testnext(ls,0x2c);
    } while (iVar7 != 0);
  }
  adjustlocalvars(ls,iVar8);
  bVar11 = pFVar3->nactvar;
  pPVar4->numparams = bVar11 - (pPVar4->is_vararg & 1);
  luaK_checkstack(pFVar3,(uint)bVar11);
  pFVar3->freereg = pFVar3->freereg + (uint)bVar11;
  checknext(ls,0x29);
  chunk(ls);
  (local_288.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  close_func(ls);
  pFVar3 = ls->fs;
  pPVar4 = pFVar3->f;
  iVar8 = pPVar4->sizep;
  lVar13 = (long)iVar8;
  if (iVar8 <= pFVar3->np) {
    ppPVar10 = (Proto **)
               luaM_growaux_(ls->L,pPVar4->p,&pPVar4->sizep,8,0x3ffff,"constant table overflow");
    pPVar4->p = ppPVar10;
  }
  iVar7 = pPVar4->sizep;
  if (iVar8 < iVar7) {
    do {
      pPVar4->p[lVar13] = (Proto *)0x0;
      lVar13 = lVar13 + 1;
    } while (iVar7 != lVar13);
  }
  ppPVar10 = pPVar4->p;
  iVar8 = pFVar3->np;
  pFVar3->np = iVar8 + 1;
  ppPVar10[iVar8] = local_288.f;
  if ((((local_288.f)->marked & 3) != 0) && ((pPVar4->marked & 4) != 0)) {
    g = ls->L->l_G;
    if (g->gcstate == '\x01') {
      reallymarkobject(g,(GCObject *)local_288.f);
    }
    else {
      pPVar4->marked = g->currentwhite & 3 | pPVar4->marked & 0xf8;
    }
  }
  iVar8 = luaK_code(pFVar3,pFVar3->np * 0x4000 - 0x3fdc,pFVar3->ls->lastline);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).s.info = iVar8;
  if ((local_288.f)->nups != '\0') {
    uVar12 = 0;
    do {
      luaK_code(pFVar3,(uint)local_288.upvalues[uVar12].info * 0x800000 +
                       (uint)(local_288.upvalues[uVar12].k != '\x06') * 4,pFVar3->ls->lastline);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (local_288.f)->nups);
  }
  return;
}

Assistant:

static void body(LexState*ls,expdesc*e,int needself,int line){
FuncState new_fs;
open_func(ls,&new_fs);
new_fs.f->linedefined=line;
checknext(ls,'(');
if(needself){
new_localvarliteral(ls,"self",0);
adjustlocalvars(ls,1);
}
parlist(ls);
checknext(ls,')');
chunk(ls);
new_fs.f->lastlinedefined=ls->linenumber;
check_match(ls,TK_END,TK_FUNCTION,line);
close_func(ls);
pushclosure(ls,&new_fs,e);
}